

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O1

double icu_63::gregorianToJD(int32_t year,int32_t month,int32_t date)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  iVar1 = year + -1;
  iVar2 = year + 2;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  dVar5 = uprv_floor_63((double)(iVar2 >> 2));
  dVar6 = uprv_floor_63((double)(iVar1 / 100));
  dVar7 = uprv_floor_63((double)(iVar1 / 400));
  uVar3 = 0;
  if ((2 < month) && (uVar3 = 0xfffffffe, (year & 3U) == 0)) {
    uVar4 = year * -0x3d70a3d7 + 0x51eb850;
    uVar3 = 0xffffffff;
    if ((uVar4 >> 2 | year * 0x40000000) < 0x28f5c29) {
      uVar3 = (uVar4 >> 4 | year * -0x70000000) < 0xa3d70b | 0xfffffffe;
    }
  }
  dVar8 = uprv_floor_63((double)(int)(date + uVar3 + (month * 0x16f + -0x16a) / 0xc));
  return dVar8 + (((double)(iVar1 * 0x16d) + 1721424.5 + dVar5) - dVar6) + dVar7;
}

Assistant:

static double gregorianToJD(int32_t year, int32_t month, int32_t date) {
   double julianDay = (JULIAN_EPOCH - 1) +
      (365 * (year - 1)) +
      uprv_floor((year - 1) / 4) +
      (-uprv_floor((year - 1) / 100)) +
      uprv_floor((year - 1) / 400) +
      uprv_floor((((367 * month) - 362) / 12) +
            ((month <= 2) ? 0 :
             (isGregorianLeap(year) ? -1 : -2)
            ) +
            date);

   return julianDay;
}